

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_expression.cc
# Opt level: O2

ostream * tchecker::operator<<(ostream *os,expression_type_t type)

{
  ostream *poVar1;
  runtime_error *this;
  
  if ((type < (EXPR_TYPE_CONJUNCTIVE_FORMULA|EXPR_TYPE_INTTERM)) &&
     ((0x1ff7fU >> (type & (EXPR_TYPE_CONJUNCTIVE_FORMULA|EXPR_TYPE_CLKCONSTR_DIAGONAL)) & 1) != 0))
  {
    poVar1 = std::operator<<(os,&DAT_001b2a2c + *(int *)(&DAT_001b2a2c + (ulong)type * 4));
    return poVar1;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"incomplete switch statement");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::ostream & operator<<(std::ostream & os, enum tchecker::expression_type_t type)
{
  switch (type) {
  case EXPR_TYPE_BAD:
    return os << "BAD";
  case EXPR_TYPE_INTTERM:
    return os << "INTTERM";
  case EXPR_TYPE_INTVAR:
    return os << "INTVAR";
  case EXPR_TYPE_INTARRAY:
    return os << "INTARRAY";
  case EXPR_TYPE_LOCALINTVAR:
    return os << "LOCALINTVAR";
  case EXPR_TYPE_LOCALINTARRAY:
    return os << "LOCALINTARRAY";
  case EXPR_TYPE_INTLVALUE:
    return os << "INTLVALUE";
  case EXPR_TYPE_CLKVAR:
    return os << "CLKVAR";
  case EXPR_TYPE_CLKARRAY:
    return os << "CLKARRAY";
  case EXPR_TYPE_CLKLVALUE:
    return os << "CLKLVALUE";
  case EXPR_TYPE_CLKDIFF:
    return os << "CLKDIFF";
  case EXPR_TYPE_INTCLKSUM:
    return os << "INTCLKSUM";
  case EXPR_TYPE_ATOMIC_PREDICATE:
    return os << "ATOMIC_PREDICATE";
  case EXPR_TYPE_CLKCONSTR_SIMPLE:
    return os << "CLKCONSTR_SIMPLE";
  case EXPR_TYPE_CLKCONSTR_DIAGONAL:
    return os << "CLKCONSTR_DIAGONAL";
  case EXPR_TYPE_CONJUNCTIVE_FORMULA:
    return os << "CONJUNCTIVE_FORMULA";
  default:
    throw std::runtime_error("incomplete switch statement");
  }
}